

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode pre_transfer(GlobalConfig *global,per_transfer *per)

{
  OperationConfig *config;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  stat fileinfo;
  stat64 local_b8;
  
  if (per->separator_err != (char *)0x0) {
    curl_mfprintf(global->errors,"%s\n");
  }
  if (per->separator != (char *)0x0) {
    curl_mprintf("%s\n");
  }
  CVar3 = CURLE_OK;
  if ((per->uploadfile != (char *)0x0) &&
     (_Var1 = stdin_upload(per->uploadfile), CVar3 = CURLE_OK, !_Var1)) {
    iVar2 = open64(per->uploadfile,0);
    per->infd = iVar2;
    if ((iVar2 != -1) && (iVar2 = fstat64(iVar2,&local_b8), iVar2 == 0)) {
      per->infdopen = true;
      CVar3 = CURLE_OK;
      if (local_b8.st_size != -1 && (local_b8.st_mode & 0xf000) == 0x8000) {
        config = per->config;
        _Var1 = tool_setopt_skip(CURLOPT_INFILESIZE_LARGE);
        CVar3 = CURLE_OK;
        if (!_Var1) {
          CVar3 = tool_setopt(per->curl,false,global,config,"CURLOPT_INFILESIZE_LARGE",
                              CURLOPT_INFILESIZE_LARGE,local_b8.st_size);
        }
      }
      (per->input).fd = per->infd;
      return CVar3;
    }
    helpf(global->errors,"Can\'t open \'%s\'!\n",per->uploadfile);
    CVar3 = CURLE_READ_ERROR;
    if (per->infd != -1) {
      close(per->infd);
      per->infd = 0;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode pre_transfer(struct GlobalConfig *global,
                             struct per_transfer *per)
{
  curl_off_t uploadfilesize = -1;
  struct_stat fileinfo;
  CURLcode result = CURLE_OK;

  if(per->separator_err)
    fprintf(global->errors, "%s\n", per->separator_err);
  if(per->separator)
    printf("%s\n", per->separator);

  if(per->uploadfile && !stdin_upload(per->uploadfile)) {
    /* VMS Note:
     *
     * Reading binary from files can be a problem...  Only FIXED, VAR
     * etc WITHOUT implied CC will work Others need a \n appended to a
     * line
     *
     * - Stat gives a size but this is UNRELIABLE in VMS As a f.e. a
     * fixed file with implied CC needs to have a byte added for every
     * record processed, this can by derived from Filesize & recordsize
     * for VARiable record files the records need to be counted!  for
     * every record add 1 for linefeed and subtract 2 for the record
     * header for VARIABLE header files only the bare record data needs
     * to be considered with one appended if implied CC
     */
#ifdef __VMS
    /* Calculate the real upload size for VMS */
    per->infd = -1;
    if(stat(per->uploadfile, &fileinfo) == 0) {
      fileinfo.st_size = VmsSpecialSize(uploadfile, &fileinfo);
      switch(fileinfo.st_fab_rfm) {
      case FAB$C_VAR:
      case FAB$C_VFC:
      case FAB$C_STMCR:
        per->infd = open(per->uploadfile, O_RDONLY | O_BINARY);
        break;
      default:
        per->infd = open(per->uploadfile, O_RDONLY | O_BINARY,
                        "rfm=stmlf", "ctx=stm");
      }
    }
    if(per->infd == -1)
#else
      per->infd = open(per->uploadfile, O_RDONLY | O_BINARY);
    if((per->infd == -1) || fstat(per->infd, &fileinfo))
#endif
    {
      helpf(global->errors, "Can't open '%s'!\n", per->uploadfile);
      if(per->infd != -1) {
        close(per->infd);
        per->infd = STDIN_FILENO;
      }
      return CURLE_READ_ERROR;
    }
    per->infdopen = TRUE;

    /* we ignore file size for char/block devices, sockets, etc. */
    if(S_ISREG(fileinfo.st_mode))
      uploadfilesize = fileinfo.st_size;

    if(uploadfilesize != -1) {
      struct OperationConfig *config = per->config; /* for the macro below */
#ifdef CURL_DISABLE_LIBCURL_OPTION
      (void)config;
#endif
      my_setopt(per->curl, CURLOPT_INFILESIZE_LARGE, uploadfilesize);
    }
    per->input.fd = per->infd;
  }
  return result;
}